

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_executor_state.cpp
# Opt level: O1

ClientContext * __thiscall duckdb::ExpressionState::GetContext(ExpressionState *this)

{
  ExpressionExecutor *this_00;
  pointer pcVar1;
  ClientContext *pCVar2;
  BinderException *this_01;
  BoundFunctionExpression *pBVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this_00 = this->root->executor;
  if ((this_00->context).ptr != (ClientContext *)0x0) {
    pCVar2 = ExpressionExecutor::GetContext(this_00);
    return pCVar2;
  }
  this_01 = (BinderException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Cannot use %s in this context","");
  pBVar3 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&this->expr->super_BaseExpression);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar1 = (pBVar3->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
           _M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,
             pcVar1 + (pBVar3->function).super_BaseScalarFunction.super_SimpleFunction.
                      super_Function.name._M_string_length);
  BinderException::BinderException<std::__cxx11::string>(this_01,&local_48,&local_68);
  __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ClientContext &ExpressionState::GetContext() {
	if (!HasContext()) {
		throw BinderException("Cannot use %s in this context", (expr.Cast<BoundFunctionExpression>()).function.name);
	}
	return root.executor->GetContext();
}